

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

void nn_ctx_leave(nn_ctx *self)

{
  int iVar1;
  nn_queue_item *pnVar2;
  nn_queue_item *local_40;
  nn_fsm_event *local_38;
  undefined1 local_30 [8];
  nn_queue eventsto;
  nn_fsm_event *event;
  nn_queue_item *item;
  nn_ctx *self_local;
  
  while( true ) {
    pnVar2 = nn_queue_pop(&self->events);
    if (pnVar2 == (nn_queue_item *)0x0) {
      local_38 = (nn_fsm_event *)0x0;
    }
    else {
      local_38 = (nn_fsm_event *)(pnVar2 + -4);
    }
    eventsto.tail = (nn_queue_item *)local_38;
    if (local_38 == (nn_fsm_event *)0x0) break;
    nn_fsm_event_process(local_38);
  }
  if (self->onleave != (nn_ctx_onleave)0x0) {
    (*self->onleave)(self);
  }
  iVar1 = nn_queue_empty(&self->eventsto);
  if (iVar1 == 0) {
    local_30 = (undefined1  [8])(self->eventsto).head;
    eventsto.head = (self->eventsto).tail;
    nn_queue_init(&self->eventsto);
    nn_mutex_unlock(&self->sync);
    while( true ) {
      local_40 = nn_queue_pop((nn_queue *)local_30);
      if (local_40 == (nn_queue_item *)0x0) {
        local_40 = (nn_queue_item *)0x0;
      }
      else {
        local_40 = local_40 + -4;
      }
      eventsto.tail = local_40;
      if (local_40 == (nn_queue_item *)0x0) break;
      nn_ctx_enter((nn_ctx *)local_40->next[5].next);
      nn_fsm_event_process((nn_fsm_event *)eventsto.tail);
      nn_ctx_leave((nn_ctx *)(eventsto.tail)->next[5].next);
    }
    nn_queue_term((nn_queue *)local_30);
  }
  else {
    nn_mutex_unlock(&self->sync);
  }
  return;
}

Assistant:

void nn_ctx_leave (struct nn_ctx *self)
{
    struct nn_queue_item *item;
    struct nn_fsm_event *event;
    struct nn_queue eventsto;

    /*  Process any queued events before leaving the context. */
    while (1) {
        item = nn_queue_pop (&self->events);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_fsm_event_process (event);
    }

    /*  Notify the owner that we are leaving the context. */
    if (nn_fast (self->onleave != NULL))
        self->onleave (self);

    /*  Shortcut in the case there are no external events. */
    if (nn_queue_empty (&self->eventsto)) {
        nn_mutex_unlock (&self->sync);
        return;
    }

    /*  Make a copy of the queue of the external events so that it does not
        get corrupted once we unlock the context. */
    eventsto = self->eventsto;
    nn_queue_init (&self->eventsto);

    nn_mutex_unlock (&self->sync);

    /*  Process any queued external events. Before processing each event
        lock the context it belongs to. */
    while (1) {
        item = nn_queue_pop (&eventsto);
        event = nn_cont (item, struct nn_fsm_event, item);
        if (!event)
            break;
        nn_ctx_enter (event->fsm->ctx);
        nn_fsm_event_process (event);
        nn_ctx_leave (event->fsm->ctx);
    }

    nn_queue_term (&eventsto);
}